

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O0

int cilkg_set_param(char *param,char *value)

{
  int iVar1;
  char *in_RDI;
  char *unaff_retaddr;
  
  cilkg_get_user_settable_values();
  iVar1 = anon_unknown.dwarf_9e99::set_param_imp<char>((global_state_t *)value,unaff_retaddr,in_RDI)
  ;
  return iVar1;
}

Assistant:

int cilkg_set_param(const char* param, const char* value)
{
    return set_param_imp(cilkg_get_user_settable_values(), param, value);
}